

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O1

void __thiscall higan::LogFile::RollFile(LogFile *this)

{
  bool bVar1;
  FileForAppend *this_00;
  pointer __p;
  __uniq_ptr_impl<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_> local_48;
  undefined1 local_40 [8];
  string file_name;
  
  bVar1 = System::MakeDirIfNotExist(&this->log_dir_,true);
  if (!bVar1) {
    RollFile();
  }
  GetFileName_abi_cxx11_((string *)local_40,this);
  this_00 = (FileForAppend *)operator_new(0x8030);
  FileForAppend::FileForAppend(this_00,(string *)local_40);
  local_48._M_t.
  super__Tuple_impl<0UL,_higan::FileForAppend_*,_std::default_delete<higan::FileForAppend>_>.
  super__Head_base<0UL,_higan::FileForAppend_*,_false>._M_head_impl =
       (tuple<higan::FileForAppend_*,_std::default_delete<higan::FileForAppend>_>)
       (_Tuple_impl<0UL,_higan::FileForAppend_*,_std::default_delete<higan::FileForAppend>_>)0x0;
  std::__uniq_ptr_impl<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_>::reset
            ((__uniq_ptr_impl<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_> *)
             &this->file_ptr_,this_00);
  std::unique_ptr<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_>::~unique_ptr
            ((unique_ptr<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_> *)
             &local_48);
  if (local_40 != (undefined1  [8])&file_name._M_string_length) {
    operator_delete((void *)local_40,file_name._M_string_length + 1);
  }
  return;
}

Assistant:

void LogFile::RollFile()
{
	bool result = System::MakeDirIfNotExist(log_dir_, true);
	if (!result)
	{
		fprintf(stderr, "create log dir failed\n");
	}

	std::string file_name = GetFileName();
	file_ptr_ = std::make_unique<FileForAppend>(file_name);
}